

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRenderTarget.cpp
# Opt level: O2

void __thiscall tcu::RenderTarget::RenderTarget(RenderTarget *this)

{
  (this->m_pixelFormat).blueBits = 0;
  (this->m_pixelFormat).alphaBits = 0;
  this->m_depthBits = 0;
  this->m_stencilBits = 0;
  this->m_width = 0;
  this->m_height = 0;
  (this->m_pixelFormat).redBits = 0;
  (this->m_pixelFormat).greenBits = 0;
  this->m_numSamples = 0;
  return;
}

Assistant:

RenderTarget::RenderTarget (void)
	: m_width		(0)
	, m_height		(0)
	, m_pixelFormat	(PixelFormat(0, 0, 0, 0))
	, m_depthBits	(0)
	, m_stencilBits	(0)
	, m_numSamples	(0)
{
}